

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.h
# Opt level: O1

void __thiscall
ThreadContext::SetReturnedValueList(ThreadContext *this,ReturnedValueList *returnedValueList)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RecyclableData *pRVar4;
  
  if ((this->recyclableData).ptr == (RecyclableData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/ThreadContext.h"
                       ,0x3d1,"(this->recyclableData != nullptr)","this->recyclableData != nullptr")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pRVar4 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  Memory::Recycler::WBSetBit((char *)&pRVar4->returnedValueList);
  (pRVar4->returnedValueList).ptr = returnedValueList;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pRVar4->returnedValueList);
  return;
}

Assistant:

void SetReturnedValueList(Js::ReturnedValueList *returnedValueList)
    {
        Assert(this->recyclableData != nullptr);
        this->recyclableData->returnedValueList = returnedValueList;
    }